

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_tec_metric_ellipse(REF_GRID ref_grid,char *root_filename)

{
  size_t sVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_DBL *pRVar4;
  REF_GRID pRVar5;
  REF_STATUS RVar6;
  FILE *pFVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  undefined8 uVar14;
  double *pdVar15;
  void *pvVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  REF_INT RVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  REF_INT nnode;
  REF_INT nface;
  REF_INT *g2l;
  REF_INT *l2g;
  REF_INT nodes [27];
  REF_DBL m [6];
  REF_DBL d [12];
  REF_DBL m_1 [6];
  char viz_file [256];
  uint local_348;
  int local_340;
  uint local_314;
  REF_GRID local_310;
  void *local_308;
  ulong local_300;
  void *local_2f8;
  FILE *local_2f0;
  uint local_2e4;
  void *local_2e0;
  REF_DICT local_2d8;
  REF_INT *local_2d0;
  void *local_2c8;
  REF_INT *local_2c0;
  void *local_2b8;
  void *local_2b0;
  uint local_2a8 [28];
  REF_DBL local_238 [5];
  double local_210 [7];
  REF_DBL local_1d8 [3];
  double adStack_1c0 [11];
  REF_DBL local_168 [6];
  char local_138 [264];
  
  pRVar2 = ref_grid->node;
  pRVar3 = ref_grid->cell[3];
  if (ref_grid->twod == 0) {
    snprintf(local_138,0x100,"%s_n%d_p%d_ellipse.tec",root_filename,(ulong)(uint)ref_grid->mpi->n,
             (ulong)(uint)ref_grid->mpi->id);
    pFVar7 = fopen(local_138,"w");
    if (pFVar7 == (FILE *)0x0) {
      printf("unable to open %s\n",local_138);
      pcVar19 = "unable to open file";
      uVar14 = 0x39a;
      goto LAB_0011bbbf;
    }
    fwrite("title=\"tecplot refine metric axes\"\n",0x23,1,pFVar7);
    fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,pFVar7);
    iVar17 = pRVar2->max;
    if ((long)iVar17 < 0) {
      pcVar19 = "malloc o2n of REF_INT negative";
      uVar14 = 0x39f;
LAB_0011b445:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar14,"ref_export_tec_metric_ellipse",pcVar19);
      return 1;
    }
    sVar1 = (long)iVar17 * 4;
    pvVar8 = malloc(sVar1);
    if (pvVar8 == (void *)0x0) {
      pcVar19 = "malloc o2n of REF_INT NULL";
      uVar14 = 0x39f;
LAB_0011bbbf:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar14,"ref_export_tec_metric_ellipse",pcVar19);
      return 2;
    }
    if (iVar17 != 0) {
      memset(pvVar8,0xff,sVar1);
    }
    local_2f0 = pFVar7;
    if (pRVar3->max < 1) {
      pvVar16 = (void *)0x0;
    }
    else {
      pvVar16 = (void *)0x0;
      iVar17 = 0;
      do {
        RVar6 = ref_cell_nodes(pRVar3,iVar17,(REF_INT *)local_2a8);
        if ((RVar6 == 0) && (iVar12 = pRVar3->node_per, 0 < (long)iVar12)) {
          lVar10 = 0;
          do {
            if (*(int *)((long)pvVar8 + (long)(int)local_2a8[lVar10] * 4) == -1) {
              *(int *)((long)pvVar8 + (long)(int)local_2a8[lVar10] * 4) = (int)pvVar16;
              pvVar16 = (void *)(ulong)((int)pvVar16 + 1);
            }
            lVar10 = lVar10 + 1;
          } while (iVar12 != lVar10);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 < pRVar3->max);
      if ((int)pvVar16 < 0) {
        pcVar19 = "malloc n2o of REF_INT negative";
        uVar14 = 0x3aa;
        goto LAB_0011b445;
      }
    }
    pFVar7 = local_2f0;
    local_2f8 = pvVar16;
    local_2c8 = pvVar16;
    pvVar16 = malloc((long)pvVar16 * 4);
    if (pvVar16 == (void *)0x0) {
      pcVar19 = "malloc n2o of REF_INT NULL";
      uVar14 = 0x3aa;
      goto LAB_0011bbbf;
    }
    iVar17 = pRVar2->max;
    if (0 < (long)iVar17) {
      lVar10 = 0;
      do {
        lVar13 = (long)*(int *)((long)pvVar8 + lVar10 * 4);
        if (lVar13 != -1) {
          *(int *)((long)pvVar16 + lVar13 * 4) = (int)lVar10;
        }
        lVar10 = lVar10 + 1;
      } while (iVar17 != lVar10);
    }
    uVar23 = (int)local_2f8 * 0x6c;
    local_310 = ref_grid;
    fprintf(pFVar7,"zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)uVar23,(ulong)uVar23,"point","felineseg");
    local_2b8 = pvVar16;
    local_2b0 = pvVar8;
    if ((int)local_2f8 == 0) {
      local_340 = 1;
    }
    else {
      pvVar8 = (void *)0x0;
      do {
        RVar24 = *(REF_INT *)((long)local_2b8 + (long)pvVar8 * 4);
        uVar23 = ref_node_metric_get(pRVar2,RVar24,local_238);
        if (uVar23 != 0) {
          pcVar19 = "get";
          uVar14 = 0x3b9;
          goto LAB_0011b8bb;
        }
        uVar23 = ref_matrix_diag_m(local_238,local_1d8);
        if (uVar23 != 0) {
          pcVar19 = "diag";
          uVar14 = 0x3ba;
          goto LAB_0011b8bb;
        }
        uVar23 = ref_matrix_descending_eig(local_1d8);
        if (uVar23 != 0) {
          pcVar19 = "sort eig";
          uVar14 = 0x3bb;
          goto LAB_0011b8bb;
        }
        lVar10 = (long)RVar24;
        pvVar16 = (void *)0x0;
        local_2e0 = pvVar8;
        do {
          local_308 = (void *)((long)pvVar16 + 1);
          uVar11 = (ulong)local_308 & 0xffffffff;
          if (local_308 == (void *)0x3) {
            uVar11 = 0;
          }
          local_300 = uVar11 * 3 + 3 & 0xffffffff;
          dVar25 = 0.0;
          iVar17 = 0x24;
          do {
            dVar26 = cos(dVar25 * 0.17453292519943278);
            dVar27 = local_1d8[(long)pvVar16];
            if (dVar27 < 0.0) {
              dVar27 = sqrt(dVar27);
            }
            else {
              dVar27 = SQRT(dVar27);
            }
            dVar28 = sin(dVar25 * 0.17453292519943278);
            dVar29 = local_1d8[uVar11];
            if (dVar29 < 0.0) {
              dVar29 = sqrt(dVar29);
            }
            else {
              dVar29 = SQRT(dVar29);
            }
            dVar29 = (dVar28 * 0.5) / dVar29;
            dVar27 = (dVar26 * 0.5) / dVar27;
            pRVar4 = pRVar2->real;
            fprintf(local_2f0," %.16e %.16e %.16e\n",
                    adStack_1c0[(long)pvVar16 * 3] * dVar27 + local_1d8[local_300] * dVar29 +
                    pRVar4[lVar10 * 0xf],
                    adStack_1c0[(long)pvVar16 * 3 + 1] * dVar27 +
                    local_1d8[(int)uVar11 * 3 + 4] * dVar29 + pRVar4[lVar10 * 0xf + 1],
                    dVar27 * adStack_1c0[(long)pvVar16 * 3 + 2] +
                    dVar29 * local_1d8[(int)uVar11 * 3 + 5] + pRVar4[lVar10 * 0xf + 2]);
            dVar25 = dVar25 + 1.0;
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
          pvVar16 = local_308;
        } while (local_308 != (void *)0x3);
        pvVar8 = (void *)((long)local_2e0 + 1);
      } while (pvVar8 != local_2c8);
      local_340 = (int)local_2f8;
      pFVar7 = local_2f0;
    }
    local_308 = (void *)CONCAT44(local_308._4_4_,(int)local_2f8 * 0x24);
    local_348 = 2;
    local_300 = local_300 & 0xffffffff00000000;
    do {
      if ((int)local_2f8 != 0) {
        uVar21 = (int)local_300 * (int)local_308;
        iVar17 = 0;
        uVar23 = local_348;
        do {
          iVar12 = 0x23;
          uVar22 = uVar23;
          do {
            fprintf(pFVar7," %d %d\n",(ulong)(uVar22 - 1),(ulong)uVar22);
            uVar22 = uVar22 + 1;
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
          fprintf(pFVar7," %d %d\n",(ulong)(iVar17 * 0x24 + uVar21 + 0x24),
                  (uVar21 | 1) + iVar17 * 0x24);
          iVar17 = iVar17 + 1;
          uVar23 = uVar23 + 0x24;
        } while (iVar17 != local_340);
      }
      iVar17 = (int)local_300 + 1;
      local_348 = local_348 + (int)local_308;
      local_300 = CONCAT44(local_300._4_4_,iVar17);
    } while (iVar17 != 3);
    free(local_2b8);
    free(local_2b0);
    uVar23 = ref_export_tec_surf_zone(local_310,(FILE *)pFVar7);
    if (uVar23 == 0) goto LAB_0011c100;
    pcVar19 = "ellipse surf";
    uVar14 = 0x3d9;
    goto LAB_0011b8bb;
  }
  snprintf(local_138,0x100,"%s_n%d_p%d_ellipse.tec",root_filename,(ulong)(uint)ref_grid->mpi->n,
           (ulong)(uint)ref_grid->mpi->id);
  pFVar7 = fopen(local_138,"w");
  if (pFVar7 == (FILE *)0x0) {
    printf("unable to open %s\n",local_138);
    pcVar19 = "unable to open file";
    uVar14 = 0x334;
LAB_0011b88e:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar14
           ,"ref_export_tec_metric_ellipse_twod",pcVar19);
    uVar23 = 2;
  }
  else {
    fwrite("title=\"tecplot refine metric axes\"\n",0x23,1,pFVar7);
    fwrite("variables = \"x\" \"y\"\n",0x14,1,pFVar7);
    iVar17 = pRVar2->max;
    if (-1 < (long)iVar17) {
      sVar1 = (long)iVar17 * 4;
      pvVar8 = malloc(sVar1);
      if (pvVar8 == (void *)0x0) {
        pcVar19 = "malloc o2n of REF_INT NULL";
        uVar14 = 0x339;
      }
      else {
        if (iVar17 != 0) {
          memset(pvVar8,0xff,sVar1);
        }
        if (pRVar3->max < 1) {
          uVar23 = 0;
        }
        else {
          uVar23 = 0;
          iVar17 = 0;
          do {
            RVar6 = ref_cell_nodes(pRVar3,iVar17,(REF_INT *)local_1d8);
            if ((RVar6 == 0) && (iVar12 = pRVar3->node_per, 0 < (long)iVar12)) {
              lVar10 = 0;
              do {
                lVar13 = (long)*(int *)((long)local_1d8 + lVar10 * 4);
                if (*(int *)((long)pvVar8 + lVar13 * 4) == -1) {
                  *(uint *)((long)pvVar8 + lVar13 * 4) = uVar23;
                  uVar23 = uVar23 + 1;
                }
                lVar10 = lVar10 + 1;
              } while (iVar12 != lVar10);
            }
            iVar17 = iVar17 + 1;
          } while (iVar17 < pRVar3->max);
          if ((int)uVar23 < 0) {
            pcVar19 = "malloc n2o of REF_INT negative";
            uVar14 = 0x344;
            goto LAB_0011b3b1;
          }
        }
        local_308 = (void *)(ulong)uVar23;
        pvVar9 = malloc((long)local_308 * 4);
        pvVar16 = local_308;
        if (pvVar9 != (void *)0x0) {
          iVar17 = pRVar2->max;
          if (0 < (long)iVar17) {
            lVar10 = 0;
            do {
              lVar13 = (long)*(int *)((long)pvVar8 + lVar10 * 4);
              if (lVar13 != -1) {
                *(int *)((long)pvVar9 + lVar13 * 4) = (int)lVar10;
              }
              lVar10 = lVar10 + 1;
            } while (iVar17 != lVar10);
          }
          uVar23 = (int)local_308 * 0xc;
          local_310 = ref_grid;
          local_2e0 = pvVar9;
          fprintf(pFVar7,"zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)uVar23,(ulong)uVar23,"point","felineseg");
          if (pvVar16 != (void *)0x0) {
            pvVar16 = (void *)0x0;
            local_2c8 = pvVar8;
            do {
              RVar24 = *(REF_INT *)((long)local_2e0 + (long)pvVar16 * 4);
              uVar23 = ref_node_metric_get(pRVar2,RVar24,local_168);
              if (uVar23 != 0) {
                pcVar19 = "get";
                uVar14 = 0x353;
                goto LAB_0011c0c8;
              }
              uVar23 = ref_matrix_diag_m(local_168,local_238);
              if (uVar23 != 0) {
                pcVar19 = "diag";
                uVar14 = 0x354;
                goto LAB_0011c0c8;
              }
              uVar23 = ref_matrix_descending_eig(local_238);
              if (uVar23 != 0) {
                pcVar19 = "sort eig";
                uVar14 = 0x355;
                goto LAB_0011c0c8;
              }
              uVar11 = 0xffffffff;
              pdVar15 = local_210;
              uVar18 = 0;
              dVar25 = -1.0;
              do {
                dVar27 = *pdVar15;
                if (dVar27 <= -dVar27) {
                  dVar27 = -dVar27;
                }
                if (dVar25 < dVar27) {
                  uVar11 = uVar18 & 0xffffffff;
                  dVar25 = dVar27;
                }
                uVar18 = uVar18 + 1;
                pdVar15 = pdVar15 + 3;
              } while (uVar18 != 3);
              iVar17 = (int)uVar11;
              if (iVar17 == -1) {
                pcVar19 = "couldn\'t find best y";
                uVar14 = 0x35e;
                goto LAB_0011b3b1;
              }
              iVar12 = (uint)(iVar17 < 2) * 3 + iVar17 + -2;
              iVar17 = iVar17 + -1 + (uint)(iVar17 < 1) * 3;
              local_300 = (ulong)(iVar12 * 3 + 3);
              local_2f0 = (FILE *)(long)(iVar17 * 3 + 3);
              dVar25 = 0.0;
              iVar20 = 0xc;
              local_2f8 = pvVar16;
              do {
                dVar26 = cos(dVar25 * 0.5235987755982983);
                dVar27 = local_238[iVar12];
                if (dVar27 < 0.0) {
                  dVar27 = sqrt(dVar27);
                }
                else {
                  dVar27 = SQRT(dVar27);
                }
                dVar28 = sin(dVar25 * 0.5235987755982983);
                dVar29 = local_238[iVar17];
                if (dVar29 < 0.0) {
                  dVar29 = sqrt(dVar29);
                }
                else {
                  dVar29 = SQRT(dVar29);
                }
                dVar29 = (dVar28 * 0.5) / dVar29;
                dVar27 = (dVar26 * 0.5) / dVar27;
                fprintf(pFVar7," %.16e %.16e\n",
                        local_238[local_300] * dVar27 + local_238[(long)local_2f0] * dVar29 +
                        pRVar2->real[(long)RVar24 * 0xf],
                        dVar27 * local_238[iVar12 * 3 + 4] + dVar29 * local_238[iVar17 * 3 + 4] +
                        pRVar2->real[(long)RVar24 * 0xf + 1]);
                pvVar8 = local_2c8;
                dVar25 = dVar25 + 1.0;
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
              pvVar16 = (void *)((long)local_2f8 + 1);
            } while (pvVar16 != local_308);
            uVar23 = 2;
            iVar17 = 0;
            do {
              iVar12 = 0xb;
              uVar21 = uVar23;
              do {
                fprintf(pFVar7," %d %d\n",(ulong)(uVar21 - 1),(ulong)uVar21);
                uVar21 = uVar21 + 1;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
              fprintf(pFVar7," %d %d\n",(ulong)(iVar17 * 0xc + 0xc),iVar17 * 0xc + 1);
              iVar17 = iVar17 + 1;
              uVar23 = uVar23 + 0xc;
            } while (iVar17 != (int)local_308);
          }
          free(local_2e0);
          free(pvVar8);
          pRVar5 = local_310;
          pRVar2 = local_310->node;
          uVar23 = ref_dict_create(&local_2d8);
          if (uVar23 == 0) {
            pRVar3 = pRVar5->cell[3];
            if (0 < pRVar3->max) {
              RVar24 = 0;
              do {
                RVar6 = ref_cell_nodes(pRVar3,RVar24,(REF_INT *)local_2a8);
                if ((RVar6 == 0) &&
                   (uVar23 = ref_dict_store(local_2d8,local_2a8[pRVar3->node_per],-1), uVar23 != 0))
                {
                  pcVar19 = "mark tri";
                  uVar14 = 0x268;
                  goto LAB_0011b817;
                }
                RVar24 = RVar24 + 1;
              } while (RVar24 < pRVar3->max);
            }
            pRVar3 = local_310->cell[6];
            if (0 < pRVar3->max) {
              iVar17 = 0;
              do {
                RVar6 = ref_cell_nodes(pRVar3,iVar17,(REF_INT *)local_2a8);
                if ((RVar6 == 0) &&
                   (uVar23 = ref_dict_store(local_2d8,local_2a8[pRVar3->node_per],-1), uVar23 != 0))
                {
                  pcVar19 = "mark qua";
                  uVar14 = 0x26d;
                  goto LAB_0011b817;
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 < pRVar3->max);
            }
            if (local_2d8->n < 1) {
LAB_0011c184:
              uVar23 = ref_dict_free(local_2d8);
              if (uVar23 == 0) {
LAB_0011c100:
                fclose(pFVar7);
                return 0;
              }
              pcVar19 = "free dict";
              uVar14 = 0x295;
            }
            else {
              uVar21 = *local_2d8->key;
              uVar23 = ref_grid_tri_qua_id_nodes
                                 (local_310,uVar21,(REF_INT *)&local_314,(REF_INT *)&local_2e4,
                                  &local_2d0,&local_2c0);
              if (uVar23 == 0) {
                lVar10 = 0;
                do {
                  fprintf(pFVar7,
                          "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                          (ulong)uVar21,(ulong)local_314,(ulong)local_2e4,"point","fequadrilateral")
                  ;
                  if (0 < (int)local_314) {
                    lVar13 = 0;
                    do {
                      pRVar4 = pRVar2->real;
                      fprintf(pFVar7," %.16e %.16e\n",pRVar4[(long)local_2c0[lVar13] * 0xf],
                              pRVar4[(long)local_2c0[lVar13] * 0xf + 1]);
                      lVar13 = lVar13 + 1;
                    } while (lVar13 < (int)local_314);
                  }
                  pRVar3 = local_310->cell[3];
                  if (0 < pRVar3->max) {
                    RVar24 = 0;
                    do {
                      RVar6 = ref_cell_nodes(pRVar3,RVar24,(REF_INT *)local_2a8);
                      if ((RVar6 == 0) && (uVar21 == local_2a8[pRVar3->node_per])) {
                        local_2a8[3] = local_2a8[2];
                        lVar13 = 0;
                        do {
                          fprintf(pFVar7," %d",(ulong)(local_2d0[(int)local_2a8[lVar13]] + 1));
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 4);
                        fputc(10,pFVar7);
                      }
                      RVar24 = RVar24 + 1;
                    } while (RVar24 < pRVar3->max);
                  }
                  pRVar3 = local_310->cell[6];
                  if (0 < pRVar3->max) {
                    RVar24 = 0;
                    do {
                      RVar6 = ref_cell_nodes(pRVar3,RVar24,(REF_INT *)local_2a8);
                      if ((RVar6 == 0) && (uVar21 == local_2a8[pRVar3->node_per])) {
                        lVar13 = 0;
                        do {
                          fprintf(pFVar7," %d",(ulong)(local_2d0[(int)local_2a8[lVar13]] + 1));
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 4);
                        fputc(10,pFVar7);
                      }
                      RVar24 = RVar24 + 1;
                    } while (RVar24 < pRVar3->max);
                  }
                  if (local_2c0 != (REF_INT *)0x0) {
                    free(local_2c0);
                  }
                  if (local_2d0 != (REF_INT *)0x0) {
                    free(local_2d0);
                  }
                  lVar10 = lVar10 + 1;
                  if (local_2d8->n <= lVar10) goto LAB_0011c184;
                  uVar21 = local_2d8->key[lVar10];
                  uVar23 = ref_grid_tri_qua_id_nodes
                                     (local_310,uVar21,(REF_INT *)&local_314,(REF_INT *)&local_2e4,
                                      &local_2d0,&local_2c0);
                } while (uVar23 == 0);
              }
              pcVar19 = "extract this boundary";
              uVar14 = 0x272;
            }
          }
          else {
            pcVar19 = "create dict";
            uVar14 = 0x263;
          }
LAB_0011b817:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 uVar14,"ref_export_tec_twod_zone",(ulong)uVar23,pcVar19);
          pcVar19 = "ellipse surf";
          uVar14 = 0x377;
LAB_0011c0c8:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 uVar14,"ref_export_tec_metric_ellipse_twod",(ulong)uVar23,pcVar19);
          goto LAB_0011b89a;
        }
        pcVar19 = "malloc n2o of REF_INT NULL";
        uVar14 = 0x344;
      }
      goto LAB_0011b88e;
    }
    pcVar19 = "malloc o2n of REF_INT negative";
    uVar14 = 0x339;
LAB_0011b3b1:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar14
           ,"ref_export_tec_metric_ellipse_twod",pcVar19);
    uVar23 = 1;
  }
LAB_0011b89a:
  pcVar19 = "2d met";
  uVar14 = 0x390;
LAB_0011b8bb:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar14,
         "ref_export_tec_metric_ellipse",(ulong)uVar23,pcVar19);
  return uVar23;
}

Assistant:

REF_FCN REF_STATUS ref_export_tec_metric_ellipse(REF_GRID ref_grid,
                                                 const char *root_filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT nnode, node;
  REF_INT *o2n, *n2o;
  REF_INT ncell, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL m[6], d[12];
  REF_DBL x, y, z;
  REF_DBL ex, ey;
  FILE *file;
  char viz_file[256];
  REF_INT i, n = 36;
  REF_INT e0, e1;
  REF_DBL dt = ref_math_in_radians(360.0 / (REF_DBL)n);
  REF_DBL scale = 0.5; /* so the ellipses touch for an ideal grid */

  if (ref_grid_twod(ref_grid)) {
    RSS(ref_export_tec_metric_ellipse_twod(ref_grid, root_filename), "2d met");
    return REF_SUCCESS;
  }

  snprintf(viz_file, 256, "%s_n%d_p%d_ellipse.tec", root_filename,
           ref_mpi_n(ref_grid_mpi(ref_grid)),
           ref_mpi_rank(ref_grid_mpi(ref_grid)));

  file = fopen(viz_file, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", viz_file);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine metric axes\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  nnode = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (REF_EMPTY == o2n[nodes[node]]) {
        o2n[nodes[node]] = nnode;
        nnode++;
      }
    }
  }

  ref_malloc(n2o, nnode, REF_INT);
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != o2n[node]) {
      n2o[o2n[node]] = node;
    }
  }

  ncell = nnode * n;

  fprintf(file,
          "zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          3 * ncell, 3 * ncell, "point", "felineseg");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_metric_get(ref_node, n2o[node], m), "get");
    RSS(ref_matrix_diag_m(m, d), "diag");
    RSS(ref_matrix_descending_eig(d), "sort eig");
    for (e0 = 0; e0 < 3; e0++) {
      e1 = e0 + 1;
      if (e1 == 3) e1 = 0;
      for (i = 0; i < n; i++) {
        ex = scale * cos(i * dt) / sqrt(d[e0]);
        ey = scale * sin(i * dt) / sqrt(d[e1]);
        x = d[3 + 3 * e0] * ex + d[3 + 3 * e1] * ey;
        y = d[4 + 3 * e0] * ex + d[4 + 3 * e1] * ey;
        z = d[5 + 3 * e0] * ex + d[5 + 3 * e1] * ey;
        fprintf(file, " %.16e %.16e %.16e\n",
                ref_node_xyz(ref_node, 0, n2o[node]) + x,
                ref_node_xyz(ref_node, 1, n2o[node]) + y,
                ref_node_xyz(ref_node, 2, n2o[node]) + z);
      }
    }
  }

  for (e0 = 0; e0 < 3; e0++)
    for (node = 0; node < nnode; node++) {
      for (i = 0; i < n - 1; i++)
        fprintf(file, " %d %d\n", i + node * n + 1 + ncell * e0,
                i + 1 + node * n + 1 + ncell * e0);
      fprintf(file, " %d %d\n", n + node * n + ncell * e0,
              1 + node * n + ncell * e0);
    }

  ref_free(n2o);
  ref_free(o2n);

  RSS(ref_export_tec_surf_zone(ref_grid, file), "ellipse surf");

  fclose(file);

  return REF_SUCCESS;
}